

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopengltexturehelper.cpp
# Opt level: O3

void __thiscall
QOpenGLTextureHelper::qt_TextureImage3DMultisample
          (QOpenGLTextureHelper *this,GLuint texture,GLenum target,GLenum bindingTarget,
          GLsizei samples,GLint internalFormat,GLsizei width,GLsizei height,GLsizei depth,
          GLboolean fixedSampleLocations)

{
  QOpenGLFunctions *pQVar1;
  GLenum GVar2;
  GLenum GVar3;
  long in_FS_OFFSET;
  bool bVar4;
  undefined8 local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = this->functions;
  bVar4 = 5 < target - 0x8515;
  GVar2 = 0x8513;
  if (bVar4) {
    GVar2 = target;
  }
  GVar3 = 0x8514;
  if (bVar4) {
    GVar3 = bindingTarget;
  }
  local_40 = CONCAT44(0xaaaaaaaa,GVar2);
  (**(code **)(*(long *)pQVar1 + 200))(GVar3,(long)&local_40 + 4);
  (*(code *)**(undefined8 **)pQVar1)(local_40 & 0xffffffff,texture);
  (*this->TexImage3DMultisample)
            (target,samples,internalFormat,width,height,depth,fixedSampleLocations);
  (*(code *)**(undefined8 **)pQVar1)(local_40 & 0xffffffff,local_40._4_4_);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QOpenGLTextureHelper::qt_TextureImage3DMultisample(GLuint texture, GLenum target, GLenum bindingTarget, GLsizei samples, GLint internalFormat, GLsizei width, GLsizei height, GLsizei depth, GLboolean fixedSampleLocations)
{
    TextureBinder binder(functions, texture, target, bindingTarget);
    glTexImage3DMultisample(target, samples, internalFormat, width, height, depth, fixedSampleLocations);
}